

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

SrcList * sqlite3SrcListAppendFromTerm
                    (Parse *pParse,SrcList *p,Token *pTable,Token *pDatabase,Token *pAlias,
                    Select *pSubquery,OnOrUsing *pOnUsing)

{
  sqlite3 *db_00;
  SrcList *pSVar1;
  int iVar2;
  char *pcVar3;
  Token *local_60;
  Token *pToken;
  sqlite3 *db;
  SrcItem *pItem;
  Select *pSubquery_local;
  Token *pAlias_local;
  Token *pDatabase_local;
  Token *pTable_local;
  SrcList *p_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  if (((p == (SrcList *)0x0) && (pOnUsing != (OnOrUsing *)0x0)) &&
     ((pOnUsing->pOn != (Expr *)0x0 || (pOnUsing->pUsing != (IdList *)0x0)))) {
    pcVar3 = "USING";
    if (pOnUsing->pOn != (Expr *)0x0) {
      pcVar3 = "ON";
    }
    sqlite3ErrorMsg(pParse,"a JOIN clause is required before %s",pcVar3);
  }
  else {
    pSVar1 = sqlite3SrcListAppend(pParse,p,pTable,pDatabase);
    if (pSVar1 != (SrcList *)0x0) {
      iVar2 = pSVar1->nSrc + -1;
      if ((1 < pParse->eParseMode) && (pSVar1->a[iVar2].zName != (char *)0x0)) {
        local_60 = pTable;
        if ((pDatabase != (Token *)0x0) && (pDatabase->z != (char *)0x0)) {
          local_60 = pDatabase;
        }
        sqlite3RenameTokenMap(pParse,pSVar1->a[iVar2].zName,local_60);
      }
      if (pAlias->n != 0) {
        pcVar3 = sqlite3NameFromToken(db_00,pAlias);
        pSVar1->a[iVar2].zAlias = pcVar3;
      }
      if ((pSubquery != (Select *)0x0) &&
         (pSVar1->a[iVar2].pSelect = pSubquery, (pSubquery->selFlags & 0x800) != 0)) {
        *(ushort *)&pSVar1->a[iVar2].fg.field_0x1 =
             *(ushort *)&pSVar1->a[iVar2].fg.field_0x1 & 0xdfff | 0x2000;
      }
      if (pOnUsing == (OnOrUsing *)0x0) {
        pSVar1->a[iVar2].u3.pOn = (Expr *)0x0;
        return pSVar1;
      }
      if (pOnUsing->pUsing != (IdList *)0x0) {
        *(ushort *)&pSVar1->a[iVar2].fg.field_0x1 =
             *(ushort *)&pSVar1->a[iVar2].fg.field_0x1 & 0xfbff | 0x400;
        pSVar1->a[iVar2].u3 = (anon_union_8_2_eeb63324_for_u3)pOnUsing->pUsing;
        return pSVar1;
      }
      pSVar1->a[iVar2].u3 = (anon_union_8_2_eeb63324_for_u3)pOnUsing->pOn;
      return pSVar1;
    }
  }
  sqlite3ClearOnOrUsing(db_00,pOnUsing);
  sqlite3SelectDelete(db_00,pSubquery);
  return (SrcList *)0x0;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListAppendFromTerm(
  Parse *pParse,          /* Parsing context */
  SrcList *p,             /* The left part of the FROM clause already seen */
  Token *pTable,          /* Name of the table to add to the FROM clause */
  Token *pDatabase,       /* Name of the database containing pTable */
  Token *pAlias,          /* The right-hand side of the AS subexpression */
  Select *pSubquery,      /* A subquery used in place of a table name */
  OnOrUsing *pOnUsing     /* Either the ON clause or the USING clause */
){
  SrcItem *pItem;
  sqlite3 *db = pParse->db;
  if( !p && pOnUsing!=0 && (pOnUsing->pOn || pOnUsing->pUsing) ){
    sqlite3ErrorMsg(pParse, "a JOIN clause is required before %s",
      (pOnUsing->pOn ? "ON" : "USING")
    );
    goto append_from_error;
  }
  p = sqlite3SrcListAppend(pParse, p, pTable, pDatabase);
  if( p==0 ){
    goto append_from_error;
  }
  assert( p->nSrc>0 );
  pItem = &p->a[p->nSrc-1];
  assert( (pTable==0)==(pDatabase==0) );
  assert( pItem->zName==0 || pDatabase!=0 );
  if( IN_RENAME_OBJECT && pItem->zName ){
    Token *pToken = (ALWAYS(pDatabase) && pDatabase->z) ? pDatabase : pTable;
    sqlite3RenameTokenMap(pParse, pItem->zName, pToken);
  }
  assert( pAlias!=0 );
  if( pAlias->n ){
    pItem->zAlias = sqlite3NameFromToken(db, pAlias);
  }
  if( pSubquery ){
    pItem->pSelect = pSubquery;
    if( pSubquery->selFlags & SF_NestedFrom ){
      pItem->fg.isNestedFrom = 1;
    }
  }
  assert( pOnUsing==0 || pOnUsing->pOn==0 || pOnUsing->pUsing==0 );
  assert( pItem->fg.isUsing==0 );
  if( pOnUsing==0 ){
    pItem->u3.pOn = 0;
  }else if( pOnUsing->pUsing ){
    pItem->fg.isUsing = 1;
    pItem->u3.pUsing = pOnUsing->pUsing;
  }else{
    pItem->u3.pOn = pOnUsing->pOn;
  }
  return p;

append_from_error:
  assert( p==0 );
  sqlite3ClearOnOrUsing(db, pOnUsing);
  sqlite3SelectDelete(db, pSubquery);
  return 0;
}